

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * make_ARB1_srcarg_string(Context *ctx,size_t idx,char *buf,size_t buflen)

{
  if (idx < 5) {
    make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + idx,buf,buflen);
  }
  else {
    fail(ctx,"Too many source args");
    *buf = '\0';
  }
  return buf;
}

Assistant:

static const char *make_ARB1_srcarg_string(Context *ctx, const size_t idx,
                                           char *buf, const size_t buflen)
{
    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        *buf = '\0';
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];
    return make_ARB1_srcarg_string_in_buf(ctx, arg, buf, buflen);
}